

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

void __thiscall
slang::ast::Compilation::noteNetAlias
          (Compilation *this,Scope *scope,Symbol *firstSym,DriverBitRange firstRange,
          Expression *firstExpr,Symbol *secondSym,DriverBitRange secondRange,Expression *secondExpr)

{
  ulong *puVar1;
  SourceRange range;
  SourceRange range_00;
  SourceRange range_01;
  SourceRange range_02;
  SourceRange range_03;
  DriverBitRange a_00;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  DriverBitRange b_00;
  DriverBitRange b_01;
  bool bVar2;
  Symbol **__x;
  bool bVar3;
  undefined1 uVar4;
  long lVar5;
  equal_to<const_slang::ast::Symbol_*> *this_00;
  raw_key_type *__y;
  SourceLocation SVar6;
  unsigned_long in_RCX;
  Symbol *in_RDX;
  long in_RDI;
  unsigned_long in_R8;
  Symbol *in_stack_00000008;
  unsigned_long in_stack_00000010;
  unsigned_long in_stack_00000018;
  Expression *in_stack_00000020;
  NetAlias *newAlias;
  Diagnostic *diag;
  NetAlias *curr;
  overlap_iterator it;
  iterator end;
  mapped_type *imap;
  bool errored;
  Expression *secondExprPtr;
  Expression *firstExprPtr;
  Symbol *b;
  Symbol *a;
  anon_class_1_0_00000001 overlaps;
  locator loc;
  size_t pos0;
  size_t hash;
  Symbol **k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  const_iterator *in_stack_fffffffffffffbe8;
  undefined7 in_stack_fffffffffffffbf0;
  undefined1 in_stack_fffffffffffffbf7;
  SourceLocation in_stack_fffffffffffffbf8;
  SourceLocation in_stack_fffffffffffffc00;
  IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>
  *in_stack_fffffffffffffc08;
  undefined7 in_stack_fffffffffffffc10;
  undefined1 in_stack_fffffffffffffc17;
  size_t in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc20;
  DiagCode in_stack_fffffffffffffc24;
  Symbol **in_stack_fffffffffffffc58;
  try_emplace_args_t *in_stack_fffffffffffffc60;
  size_t in_stack_fffffffffffffc68;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>_>_>
  *in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  SourceLocation in_stack_fffffffffffffd30;
  SourceLocation in_stack_fffffffffffffd38;
  undefined8 in_stack_fffffffffffffd40;
  DiagCode code;
  Expression *local_1b8;
  Expression *local_1b0;
  Symbol *local_1a8;
  Symbol *local_1a0;
  anon_class_1_0_00000001 local_191 [33];
  unsigned_long local_170;
  unsigned_long uStack_168;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_160;
  Symbol **local_148;
  long local_140;
  undefined1 local_131;
  Symbol **local_130;
  long local_128;
  bool local_119 [25];
  iterator local_100;
  bool local_e9 [25];
  iterator local_d0;
  bool local_b9;
  iterator local_b8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>_>
  local_a8;
  size_t local_90;
  size_t local_88;
  Symbol **local_80;
  Symbol **local_78;
  undefined1 *local_70;
  long local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  Symbol **local_10;
  long local_8;
  
  local_191[0] = (anon_class_1_0_00000001)0x0;
  local_1a8 = in_stack_00000008;
  local_1b8 = in_stack_00000020;
  local_1a0 = in_RDX;
  local_170 = in_RCX;
  uStack_168 = in_R8;
  if (in_stack_00000008 < in_RDX) {
    std::swap<slang::ast::Symbol_const*>(&local_1a0,&local_1a8);
    std::swap<unsigned_long,unsigned_long>
              ((pair<unsigned_long,_unsigned_long> *)
               CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
               (pair<unsigned_long,_unsigned_long> *)in_stack_fffffffffffffbe8);
    std::swap<slang::ast::Expression_const*>(&local_1b0,&local_1b8);
  }
  bVar2 = false;
  lVar5 = in_RDI + 0xbe0;
  local_148 = &local_1a0;
  local_70 = &local_131;
  local_140 = lVar5;
  local_130 = local_148;
  local_128 = lVar5;
  local_78 = local_148;
  local_68 = lVar5;
  local_80 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>>>>
             ::key_from<slang::ast::Symbol_const*>(local_148);
  local_88 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>>>>
             ::hash_for<slang::ast::Symbol_const*>
                       ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>_>_>
                         *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                        (Symbol **)in_stack_fffffffffffffbe8);
  local_90 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>_>_>
             ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                            (size_t)in_stack_fffffffffffffbe8);
  local_10 = local_80;
  local_20 = local_88;
  local_18 = local_90;
  local_8 = lVar5;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_90);
  do {
    local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
    local_40 = boost::unordered::detail::foa::
               table_arrays<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>_>_>
               ::groups((table_arrays<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>_>_>
                         *)0x34be11);
    local_40 = local_40 + local_38;
    local_44 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::match((group15<boost::unordered::detail::foa::plain_integral> *)
                       in_stack_fffffffffffffbf8,
                       CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
    if (local_44 != 0) {
      local_50 = boost::unordered::detail::foa::
                 table_arrays<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>_>_>
                 ::elements((table_arrays<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>_>_>
                             *)0x34be5c);
      local_58 = local_50 + local_38 * 0xf;
      do {
        local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
        this_00 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>_>_>
                  ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>_>_>
                          *)0x34beaf);
        __x = local_10;
        __y = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>>>>
              ::
              key_from<std::pair<slang::ast::Symbol_const*const,slang::IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>>>
                        ((pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>
                          *)0x34bedf);
        bVar3 = std::equal_to<const_slang::ast::Symbol_*>::operator()(this_00,__x,__y);
        if (bVar3) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>_>
          ::table_locator(&local_a8,local_40,local_5c,local_58 + local_5c);
          goto LAB_0034bfd6;
        }
        local_44 = local_44 - 1 & local_44;
      } while (local_44 != 0);
    }
    bVar3 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                              (size_t)in_stack_fffffffffffffbe8);
    if (bVar3) {
      memset(&local_a8,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>_>
      ::table_locator(&local_a8);
      goto LAB_0034bfd6;
    }
    bVar3 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      (&local_30,*(size_t *)(in_RDI + 0xbe8));
  } while (bVar3);
  memset(&local_a8,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>_>
  ::table_locator(&local_a8);
LAB_0034bfd6:
  bVar3 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                    ((table_locator *)&local_a8);
  if (bVar3) {
    local_b8 = boost::unordered::detail::foa::
               table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>_>_>
               ::make_iterator((locator *)0x34bff6);
    local_b9 = false;
    std::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
    ::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
              (&local_160,&local_b8,&local_b9);
  }
  else if (*(ulong *)(in_RDI + 0xc08) < *(ulong *)(in_RDI + 0xc00)) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*const&>
              ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
               in_stack_fffffffffffffc18,
               CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
               (try_emplace_args_t *)in_stack_fffffffffffffc08,(Symbol **)in_stack_fffffffffffffc00)
    ;
    local_d0 = boost::unordered::detail::foa::
               table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>_>_>
               ::make_iterator((locator *)0x34c07e);
    local_e9[0] = true;
    std::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
    ::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
              (&local_160,&local_d0,local_e9);
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*const&>
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
               in_stack_fffffffffffffc58);
    local_100 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>_>_>
                ::make_iterator((locator *)0x34c0ec);
    local_119[0] = true;
    std::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
    ::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
              (&local_160,&local_100,local_119);
  }
  boost::unordered::detail::foa::
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
  IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>::end
            (in_stack_fffffffffffffc08);
  IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>::find
            ((IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U> *)
             in_stack_fffffffffffffbf8,
             (pair<unsigned_long,_unsigned_long> *)
             CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
  do {
    bVar3 = IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>::
            overlap_iterator::operator==
                      ((overlap_iterator *)
                       CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                       in_stack_fffffffffffffbe8);
    code = SUB84((ulong)in_stack_fffffffffffffd40 >> 0x20,0);
    in_stack_fffffffffffffc24.code._1_1_ = bVar3;
    if (((bVar3 ^ 0xffU) & 1) == 0) {
LAB_0034c474:
      IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>::overlap_iterator::
      ~overlap_iterator((overlap_iterator *)0x34c481);
      SVar6 = (SourceLocation)
              BumpAllocator::
              emplace<slang::ast::Compilation::NetAlias,slang::ast::Symbol_const*&,std::pair<unsigned_long,unsigned_long>&,slang::ast::Expression_const*&,slang::ast::Expression_const*&>
                        ((BumpAllocator *)in_stack_fffffffffffffc00,
                         (Symbol **)in_stack_fffffffffffffbf8,
                         (pair<unsigned_long,_unsigned_long> *)
                         CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                         (Expression **)in_stack_fffffffffffffbe8,(Expression **)0x34c4a8);
      IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>::insert
                ((IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U> *)
                 in_stack_fffffffffffffc00,(pair<unsigned_long,_unsigned_long> *)SVar6,
                 (NetAlias **)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                 (allocator_type *)in_stack_fffffffffffffbe8);
      if (((!bVar2) && (local_1a0 == local_1a8)) &&
         (b_01.second = in_stack_00000018, b_01.first = in_stack_00000010, a_00.second = uStack_168,
         a_00.first = local_170,
         uVar4 = noteNetAlias::anon_class_1_0_00000001::operator()(local_191,a_00,b_01), (bool)uVar4
         )) {
        sourceRange_01.endLoc = in_stack_fffffffffffffd38;
        sourceRange_01.startLoc = in_stack_fffffffffffffd30;
        Scope::addDiag((Scope *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),code,
                       sourceRange_01);
        range_00.endLoc = in_stack_fffffffffffffc00;
        range_00.startLoc = SVar6;
        Diagnostic::operator<<((Diagnostic *)CONCAT17(uVar4,in_stack_fffffffffffffbf0),range_00);
      }
      IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>::iterator::~iterator
                ((iterator *)0x34c5e6);
      return;
    }
    SVar6 = (SourceLocation)
            IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>::
            overlap_iterator::operator*((overlap_iterator *)in_stack_fffffffffffffc00);
    puVar1 = *(ulong **)SVar6;
    if ((Symbol *)*puVar1 == local_1a8) {
      b_00.second = in_stack_00000018;
      b_00.first = in_stack_00000010;
      uVar4 = noteNetAlias::anon_class_1_0_00000001::operator()
                        (local_191,*(DriverBitRange *)(puVar1 + 1),b_00);
      code = SUB84((ulong)in_stack_fffffffffffffd40 >> 0x20,0);
      if ((bool)uVar4) {
        bVar2 = true;
        if ((Symbol *)*puVar1 == local_1a0) {
          sourceRange.endLoc = in_stack_fffffffffffffd38;
          sourceRange.startLoc = in_stack_fffffffffffffd30;
          Scope::addDiag((Scope *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),code
                         ,sourceRange);
          in_stack_fffffffffffffd38 = (local_1b8->sourceRange).startLoc;
          code = SUB84((local_1b8->sourceRange).endLoc,4);
          range.endLoc = in_stack_fffffffffffffc00;
          range.startLoc = in_stack_fffffffffffffbf8;
          Diagnostic::operator<<
                    ((Diagnostic *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                     range);
        }
        else {
          in_stack_fffffffffffffd2c = 0x18000d;
          sourceRange_00.endLoc = in_stack_fffffffffffffd38;
          sourceRange_00.startLoc = in_stack_fffffffffffffd30;
          in_stack_fffffffffffffc00 =
               (SourceLocation)
               Scope::addDiag((Scope *)CONCAT44(0x18000d,in_stack_fffffffffffffd28),code,
                              sourceRange_00);
          range_01.startLoc._7_1_ = uVar4;
          range_01.startLoc._0_7_ = in_stack_fffffffffffffc10;
          range_01.endLoc = SVar6;
          in_stack_fffffffffffffd30 = in_stack_fffffffffffffc00;
          Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc24,
                              range_01);
          range_02.startLoc._7_1_ = uVar4;
          range_02.startLoc._0_7_ = in_stack_fffffffffffffc10;
          range_02.endLoc = SVar6;
          Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc24,
                              range_02);
          range_03.startLoc._7_1_ = uVar4;
          range_03.startLoc._0_7_ = in_stack_fffffffffffffc10;
          range_03.endLoc = SVar6;
          Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc24,
                              range_03);
        }
        goto LAB_0034c474;
      }
    }
    IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>::overlap_iterator::
    operator++((overlap_iterator *)in_stack_fffffffffffffc00);
  } while( true );
}

Assistant:

void Compilation::noteNetAlias(const Scope& scope, const Symbol& firstSym,
                               DriverBitRange firstRange, const Expression& firstExpr,
                               const Symbol& secondSym, DriverBitRange secondRange,
                               const Expression& secondExpr) {
    SLANG_ASSERT(!isFrozen());
    SLANG_ASSERT(firstRange.second - firstRange.first == secondRange.second - secondRange.first);

    auto overlaps = [](DriverBitRange a, DriverBitRange b) {
        return a.first <= b.second && b.first <= a.second;
    };

    const Symbol* a = &firstSym;
    const Symbol* b = &secondSym;
    const Expression* firstExprPtr = &firstExpr;
    const Expression* secondExprPtr = &secondExpr;
    if (a > b) {
        std::swap(a, b);
        std::swap(firstRange, secondRange);
        std::swap(firstExprPtr, secondExprPtr);
    }

    bool errored = false;
    auto& imap = netAliases[a];
    const auto end = imap.end();
    for (auto it = imap.find(firstRange); it != end; ++it) {
        auto curr = *it;
        if (curr->sym == b && overlaps(curr->range, secondRange)) {
            errored = true;
            if (curr->sym == a) {
                scope.addDiag(diag::NetAliasSelf, firstExprPtr->sourceRange)
                    << secondExprPtr->sourceRange;
            }
            else {
                auto& diag = scope.addDiag(diag::MultipleNetAlias, firstExprPtr->sourceRange);
                diag.addNote(diag::NoteAliasedTo, secondExprPtr->sourceRange);
                diag.addNote(diag::NoteAliasDeclaration, curr->firstExpr->sourceRange);
                diag.addNote(diag::NoteAliasedTo, curr->secondExpr->sourceRange);
            }
            break;
        }
    }

    auto newAlias = emplace<NetAlias>(b, secondRange, firstExprPtr, secondExprPtr);
    imap.insert(firstRange, newAlias, netAliasAllocator);

    if (!errored && a == b && overlaps(firstRange, secondRange)) {
        scope.addDiag(diag::NetAliasSelf, firstExprPtr->sourceRange) << secondExprPtr->sourceRange;
    }
}